

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

Vec_Int_t * Acb_NtkCollectCopies(Acb_Ntk_t *p,Gia_Man_t *pGia,Vec_Ptr_t **pvNodesR)

{
  int iVar1;
  int Lit;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t *p_02;
  Gia_Obj_t *pObj;
  void *pvVar3;
  char *pcVar4;
  Vec_Ptr_t *vNodesR;
  Vec_Int_t *vNodes;
  Vec_Int_t *vObjs;
  int iLit;
  int iObj;
  int i;
  Vec_Ptr_t **pvNodesR_local;
  Gia_Man_t *pGia_local;
  Acb_Ntk_t *p_local;
  
  p_00 = Acb_NtkFindNodes2(p);
  iVar1 = Acb_NtkObjNum(p);
  p_01 = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManObjNum(pGia);
  p_02 = Vec_PtrStart(iVar1);
  for (iLit = 0; iVar1 = Vec_IntSize(p_00), iLit < iVar1; iLit = iLit + 1) {
    iVar1 = Vec_IntEntry(p_00,iLit);
    Lit = Acb_ObjCopy(p,iVar1);
    if (-1 < Lit) {
      iVar2 = Abc_Lit2Var(Lit);
      pObj = Gia_ManObj(pGia,iVar2);
      iVar2 = Gia_ObjIsAnd(pObj);
      if (iVar2 != 0) {
        iVar2 = Abc_Lit2Var(Lit);
        pvVar3 = Vec_PtrEntry(p_02,iVar2);
        if (pvVar3 == (void *)0x0) {
          iVar2 = Abc_Lit2Var(Lit);
          pcVar4 = Acb_ObjNameStr(p,iVar1);
          pcVar4 = Abc_UtilStrsav(pcVar4);
          Vec_PtrWriteEntry(p_02,iVar2,pcVar4);
          iVar1 = Abc_Lit2Var(Lit);
          Vec_IntPush(p_01,iVar1);
        }
      }
    }
  }
  Vec_IntFree(p_00);
  Vec_IntSort(p_01,0);
  *pvNodesR = p_02;
  return p_01;
}

Assistant:

Vec_Int_t * Acb_NtkCollectCopies( Acb_Ntk_t * p, Gia_Man_t * pGia, Vec_Ptr_t ** pvNodesR )
{
    int i, iObj, iLit;
    Vec_Int_t * vObjs   = Acb_NtkFindNodes2( p );
    Vec_Int_t * vNodes  = Vec_IntAlloc( Acb_NtkObjNum(p) );
    Vec_Ptr_t * vNodesR = Vec_PtrStart( Gia_ManObjNum(pGia) );
    Vec_IntForEachEntry( vObjs, iObj, i )
        if ( (iLit = Acb_ObjCopy(p, iObj)) >= 0 && Gia_ObjIsAnd(Gia_ManObj(pGia, Abc_Lit2Var(iLit))) )
        {
            if ( Vec_PtrEntry(vNodesR, Abc_Lit2Var(iLit)) == NULL )
            {
                Vec_PtrWriteEntry( vNodesR, Abc_Lit2Var(iLit), Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
                Vec_IntPush( vNodes, Abc_Lit2Var(iLit) );
            }
        }
    Vec_IntFree( vObjs );
    Vec_IntSort( vNodes, 0 );
    *pvNodesR = vNodesR;
    return vNodes;
}